

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHMap.hpp
# Opt level: O1

bool __thiscall
Lib::DHMap<Kernel::VarSpec,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::
DomainIteratorCore::hasNext(DomainIteratorCore *this)

{
  uint uVar1;
  Entry *pEVar2;
  Entry *pEVar3;
  bool bVar4;
  
  pEVar3 = (this->_base)._next;
  pEVar2 = (this->_base)._last;
  bVar4 = pEVar3 != pEVar2;
  if (bVar4) {
    uVar1 = (this->_base)._timestamp;
    bVar4 = true;
    if (((pEVar3->field_0)._infoData & 1U) != 0 || (uint)(pEVar3->field_0)._infoData >> 2 != uVar1)
    {
      do {
        pEVar3 = pEVar3 + 1;
        (this->_base)._next = pEVar3;
        bVar4 = pEVar3 != pEVar2;
        if (pEVar3 == pEVar2) {
          return bVar4;
        }
      } while (((pEVar3->field_0)._infoData & 1U) != 0 ||
               (uint)(pEVar3->field_0)._infoData >> 2 != uVar1);
    }
  }
  return bVar4;
}

Assistant:

inline bool hasNext() { return _base.hasNext(); }